

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void interleave_data(float *in,float *out,int frames,int channels)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  float *pfVar4;
  ulong uVar5;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < channels) {
    uVar2 = (ulong)(uint)channels;
  }
  uVar3 = 0;
  if (0 < frames) {
    uVar3 = (ulong)(uint)frames;
  }
  for (; uVar1 != uVar3; uVar1 = uVar1 + 1) {
    pfVar4 = in;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      out[uVar5] = *pfVar4;
      pfVar4 = pfVar4 + frames;
    }
    out = out + channels;
    in = in + 1;
  }
  return;
}

Assistant:

void
interleave_data (const float *in, float *out, int frames, int channels)
{	int fr, ch ;

	for (fr = 0 ; fr < frames ; fr++)
		for (ch = 0 ; ch < channels ; ch++)
			out [ch + channels * fr] = in [fr + frames * ch] ;

	return ;
}